

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryGetParent(InMemoryDirectory *this,StringPtr name)

{
  Impl **ppIVar1;
  ReadableDirectory *extraout_RDX;
  EntryImpl *entry;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> LVar2;
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> MVar3;
  StringPtr name_00;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_50 [24];
  
  name_00.content.size_ = name.content.size_;
  ppIVar1 = &((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)name.content.ptr)
             [1].ptr;
  LVar2 = MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
                    ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                     &stack0xffffffffffffffc8,ppIVar1);
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_50,ppIVar1,
             LVar2.ptr);
  name_00.content.ptr = (char *)local_50._8_8_;
  Impl::tryGetEntry((Impl *)(local_50 + 0x10),name_00);
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
            ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)local_50);
  if ((Maybe<kj::_::Mutex::Waiter_&> *)local_50._16_8_ == (Maybe<kj::_::Mutex::Waiter_&> *)0x0) {
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  }
  else {
    asDirectory(this,(Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
                     name.content.ptr,(EntryImpl *)&stack0xffffffffffffffc8);
  }
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked
            ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)
             &stack0xffffffffffffffc8);
  MVar3.ptr.ptr = extraout_RDX;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>)MVar3.ptr;
}

Assistant:

kj::Maybe<Own<const ReadableDirectory>> tryGetParent(kj::StringPtr name) const {
    auto lock = impl.lockShared();
    KJ_IF_SOME(entry, impl.lockShared()->tryGetEntry(name)) {
      return asDirectory(lock, entry);
    } else {
      return kj::none;
    }
  }